

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

void __thiscall llvm::yaml::Input::endMapping(Input *this)

{
  uint uVar1;
  HNode *pHVar2;
  _func_int **pp_Var3;
  Child CVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ulong uVar6;
  NodeKind LHSKind;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  Child CVar9;
  _func_int *p_Var10;
  Child CVar11;
  Child local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  NodeKind local_a8;
  char cStack_a7;
  undefined6 uStack_a6;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  NodeKind local_90;
  char cStack_8f;
  undefined6 uStack_8e;
  uint local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  NodeKind local_78;
  char cStack_77;
  undefined6 uStack_76;
  Input *local_70;
  Child local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  Child local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if ((((this->EC)._M_value == 0) && (pHVar2 = this->CurrentNode, pHVar2 != (HNode *)0x0)) &&
     (pHVar2->_node->TypeID == 4)) {
    pp_Var3 = pHVar2[1]._vptr_HNode;
    uVar1 = *(uint *)&pHVar2[1]._node;
    pp_Var8 = pp_Var3;
    if ((ulong)uVar1 != 0) {
      for (; (*pp_Var8 == (_func_int *)0x0 || (*pp_Var8 == (_func_int *)0xfffffffffffffff8));
          pp_Var8 = pp_Var8 + 1) {
      }
    }
    if (pp_Var8 != pp_Var3 + uVar1) {
      p_Var10 = *pp_Var8;
      pp_Var7 = pHVar2[3]._vptr_HNode;
      uVar6 = (ulong)*(uint *)&pHVar2[3]._node;
      local_70 = this;
      do {
        uStack_60 = *(undefined8 *)p_Var10;
        local_68.decUL = (unsigned_long *)(p_Var10 + 0x10);
        pbVar5 = std::
                 __find_if<std::__cxx11::string*,__gnu_cxx::__ops::_Iter_equals_val<llvm::StringRef_const>>
                           (pp_Var7,pp_Var7 + uVar6 * 4,&local_68);
        pp_Var7 = pHVar2[3]._vptr_HNode;
        uVar6 = (ulong)*(uint *)&pHVar2[3]._node;
        if (pbVar5 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (pp_Var7 + uVar6 * 4)) {
          pHVar2 = *(HNode **)(p_Var10 + 8);
          Twine::Twine((Twine *)&local_b8,"unknown key \'");
          local_c0 = *(undefined8 *)p_Var10;
          local_c8.decUL = (unsigned_long *)(p_Var10 + 0x10);
          Twine::Twine((Twine *)&local_a0,(StringRef *)&local_c8);
          if ((local_a8 == NullKind) || (local_90 == NullKind)) {
            local_48.twine = (Twine *)0x0;
            uStack_40 = 0;
            local_38 = CONCAT62(local_38._2_6_,0x100);
          }
          else {
            if (local_a8 == EmptyKind) {
              local_38 = CONCAT62(uStack_8e,CONCAT11(cStack_8f,local_90));
            }
            else {
              if (local_90 != EmptyKind) {
                CVar4._4_4_ = uStack_b4;
                CVar4.decUI = local_b8;
                if (cStack_a7 != '\x01') {
                  local_a8 = TwineKind;
                  CVar4.twine = (Twine *)&local_b8;
                }
                if (cStack_8f != '\x01') {
                  local_90 = TwineKind;
                }
                CVar11._4_4_ = uStack_9c;
                CVar11.decUI = local_a0;
                CVar9.twine = (Twine *)&local_a0;
                if (cStack_8f == '\x01') {
                  CVar9 = CVar11;
                }
                Twine::Twine((Twine *)&local_48,CVar4,local_a8,CVar9,local_90);
                goto LAB_00dac54a;
              }
              local_38 = CONCAT62(uStack_a6,CONCAT11(cStack_a7,local_a8));
              local_a0 = local_b8;
              uStack_9c = uStack_b4;
              uStack_98 = uStack_b0;
              uStack_94 = uStack_ac;
            }
            local_48._4_4_ = uStack_9c;
            local_48.decUI = local_a0;
            uStack_40 = CONCAT44(uStack_94,uStack_98);
          }
LAB_00dac54a:
          Twine::Twine((Twine *)&local_88,"\'");
          if (((NodeKind)local_38 == NullKind) || (local_78 == NullKind)) {
            local_68.twine = (Twine *)0x0;
            uStack_60 = 0;
            local_58 = CONCAT62(local_58._2_6_,0x100);
          }
          else {
            if ((NodeKind)local_38 == EmptyKind) {
              local_58 = CONCAT62(uStack_76,CONCAT11(cStack_77,local_78));
            }
            else {
              if (local_78 != EmptyKind) {
                CVar4 = local_48;
                LHSKind = (NodeKind)local_38;
                if (local_38._1_1_ != '\x01') {
                  CVar4.twine = (Twine *)&local_48;
                  LHSKind = TwineKind;
                }
                if (cStack_77 != '\x01') {
                  local_78 = TwineKind;
                }
                CVar9._4_4_ = uStack_84;
                CVar9.decUI = local_88;
                CVar11.twine = (Twine *)&local_88;
                if (cStack_77 == '\x01') {
                  CVar11 = CVar9;
                }
                Twine::Twine((Twine *)&local_68,CVar4,LHSKind,CVar11,local_78);
                goto LAB_00dac5e1;
              }
              local_58 = local_38;
              local_88 = local_48.decUI;
              uStack_84 = local_48._4_4_;
              uStack_80 = (undefined4)uStack_40;
              uStack_7c = uStack_40._4_4_;
            }
            local_68._4_4_ = uStack_84;
            local_68.decUI = local_88;
            uStack_60 = CONCAT44(uStack_7c,uStack_80);
          }
LAB_00dac5e1:
          setError(local_70,pHVar2,(Twine *)&local_68);
          return;
        }
        do {
          do {
            pp_Var8 = pp_Var8 + 1;
            p_Var10 = *pp_Var8;
          } while (p_Var10 == (_func_int *)0x0);
        } while (p_Var10 == (_func_int *)0xfffffffffffffff8);
      } while (pp_Var8 != pp_Var3 + uVar1);
    }
  }
  return;
}

Assistant:

void Input::endMapping() {
  if (EC)
    return;
  // CurrentNode can be null if the document is empty.
  MapHNode *MN = dyn_cast_or_null<MapHNode>(CurrentNode);
  if (!MN)
    return;
  for (const auto &NN : MN->Mapping) {
    if (!is_contained(MN->ValidKeys, NN.first())) {
      setError(NN.second.get(), Twine("unknown key '") + NN.first() + "'");
      break;
    }
  }
}